

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

int SetChunk(char *fourcc,int chunk_num,WebPChunkIterator *iter)

{
  WebPDemuxer *dmux_00;
  uint8_t *puVar1;
  int iVar2;
  Chunk *pCVar3;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  Chunk *chunk;
  uint8_t *mem_buf;
  int count;
  WebPDemuxer *dmux;
  int local_14;
  int local_4;
  
  dmux_00 = *(WebPDemuxer **)(in_RDX + 0xc);
  if (((dmux_00 == (WebPDemuxer *)0x0) || (in_RDI == (char *)0x0)) || (in_ESI < 0)) {
    local_4 = 0;
  }
  else {
    iVar2 = ChunkCount(dmux_00,in_RDI);
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      local_14 = in_ESI;
      if (in_ESI == 0) {
        local_14 = iVar2;
      }
      if (iVar2 < local_14) {
        local_4 = 0;
      }
      else {
        puVar1 = (dmux_00->mem_).buf_;
        pCVar3 = GetChunk(dmux_00,in_RDI,local_14);
        *(uint8_t **)(in_RDX + 2) = puVar1 + (pCVar3->data_).offset_ + 8;
        *(size_t *)(in_RDX + 4) = (pCVar3->data_).size_ - 8;
        in_RDX[1] = iVar2;
        *in_RDX = local_14;
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int SetChunk(const char fourcc[4], int chunk_num,
                    WebPChunkIterator* const iter) {
  const WebPDemuxer* const dmux = (WebPDemuxer*)iter->private_;
  int count;

  if (dmux == NULL || fourcc == NULL || chunk_num < 0) return 0;
  count = ChunkCount(dmux, fourcc);
  if (count == 0) return 0;
  if (chunk_num == 0) chunk_num = count;

  if (chunk_num <= count) {
    const uint8_t* const mem_buf = dmux->mem_.buf_;
    const Chunk* const chunk = GetChunk(dmux, fourcc, chunk_num);
    iter->chunk.bytes = mem_buf + chunk->data_.offset_ + CHUNK_HEADER_SIZE;
    iter->chunk.size  = chunk->data_.size_ - CHUNK_HEADER_SIZE;
    iter->num_chunks  = count;
    iter->chunk_num   = chunk_num;
    return 1;
  }
  return 0;
}